

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_status ghc::filesystem::detail::file_status_from_st_mode<unsigned_int>(uint mode)

{
  perms in_SI;
  file_status in_RDI;
  perms prms;
  file_type ft;
  undefined4 local_10;
  
  local_10 = unknown;
  if ((in_SI & ~mask) == 0x4000) {
    local_10 = directory;
  }
  else if ((in_SI & ~mask) == 0x8000) {
    local_10 = regular;
  }
  else if ((in_SI & ~mask) == 0x2000) {
    local_10 = character;
  }
  else if ((in_SI & ~mask) == 0x6000) {
    local_10 = block;
  }
  else if ((in_SI & ~mask) == 0x1000) {
    local_10 = fifo;
  }
  else if ((in_SI & ~mask) == 0xa000) {
    local_10 = symlink;
  }
  else if ((in_SI & ~mask) == 0xc000) {
    local_10 = socket;
  }
  file_status::file_status((file_status *)in_RDI,local_10,in_SI & mask);
  return in_RDI;
}

Assistant:

GHC_INLINE file_status file_status_from_st_mode(T mode)
{
#ifdef GHC_OS_WINDOWS
    file_type ft = file_type::unknown;
    if ((mode & _S_IFDIR) == _S_IFDIR) {
        ft = file_type::directory;
    }
    else if ((mode & _S_IFREG) == _S_IFREG) {
        ft = file_type::regular;
    }
    else if ((mode & _S_IFCHR) == _S_IFCHR) {
        ft = file_type::character;
    }
    perms prms = static_cast<perms>(mode & 0xfff);
    return file_status(ft, prms);
#else
    file_type ft = file_type::unknown;
    if (S_ISDIR(mode)) {
        ft = file_type::directory;
    }
    else if (S_ISREG(mode)) {
        ft = file_type::regular;
    }
    else if (S_ISCHR(mode)) {
        ft = file_type::character;
    }
    else if (S_ISBLK(mode)) {
        ft = file_type::block;
    }
    else if (S_ISFIFO(mode)) {
        ft = file_type::fifo;
    }
    else if (S_ISLNK(mode)) {
        ft = file_type::symlink;
    }
    else if (S_ISSOCK(mode)) {
        ft = file_type::socket;
    }
    perms prms = static_cast<perms>(mode & 0xfff);
    return file_status(ft, prms);
#endif
}